

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

VarTerm * new_var_term(Token *name,void *expr,Type *type,Modifier *modifier)

{
  void *any;
  VarTerm *pVVar1;
  TreeNode *pTVar2;
  VarTerm *term;
  Modifier *modifier_local;
  Type *type_local;
  void *expr_local;
  Token *name_local;
  
  any = malloc(0x28);
  pVVar1 = (VarTerm *)require_not_null(any,"Failed to allocate space");
  pTVar2 = new_tree_node(name,var_eval);
  (pVVar1->node).eval = pTVar2->eval;
  (pVVar1->node).token = pTVar2->token;
  pVVar1->value = expr;
  pVVar1->modifier = modifier;
  pVVar1->type = type;
  return pVVar1;
}

Assistant:

VarTerm *new_var_term(Token *name, void *expr, Type* type, Modifier* modifier) {
    VarTerm *term = new(VarTerm);
    term->node = tree_node_(name, eval_handler(var_eval));
    term->value = expr;
    term->modifier = modifier;
    term->type = type;
    return term;
}